

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O0

void __thiscall cmCustomCommand::cmCustomCommand(cmCustomCommand *this)

{
  Snapshot snapshot;
  cmCommandContext local_60;
  Snapshot local_28;
  cmCustomCommand *local_10;
  cmCustomCommand *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Byproducts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines);
  cmState::Snapshot::Snapshot(&local_28,(cmState *)0x0);
  cmCommandContext::cmCommandContext(&local_60);
  snapshot.Position.Tree = local_28.Position.Tree;
  snapshot.State = local_28.State;
  snapshot.Position.Position = local_28.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_60);
  cmCommandContext::~cmCommandContext(&local_60);
  ImplicitDependsList::ImplicitDependsList(&this->ImplicitDepends);
  std::__cxx11::string::string((string *)&this->Comment);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  this->HaveComment = false;
  this->EscapeOldStyle = true;
  this->EscapeAllowMakeVars = false;
  this->UsesTerminal = false;
  return;
}

Assistant:

cmCustomCommand::cmCustomCommand()
  : Backtrace()
{
  this->HaveComment = false;
  this->EscapeOldStyle = true;
  this->EscapeAllowMakeVars = false;
  this->UsesTerminal = false;
}